

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

size_t __thiscall proto3_unittest::TestHasbits::ByteSizeLong(TestHasbits *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t *puVar3;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestHasbits *this_;
  TestHasbits *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = google::protobuf::internal::HasBits<3>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 0xff) != 0) {
    if (((uVar1 & 1) != 0) && (bVar2 = _internal_b1(this), bVar2)) {
      sStack_58 = 2;
    }
    if (((uVar1 & 2) != 0) && (bVar2 = _internal_b2(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 4) != 0) && (bVar2 = _internal_b3(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 8) != 0) && (bVar2 = _internal_b4(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x10) != 0) && (bVar2 = _internal_b5(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x20) != 0) && (bVar2 = _internal_b6(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x40) != 0) && (bVar2 = _internal_b7(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x80) != 0) && (bVar2 = _internal_b8(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if (((uVar1 & 0x100) != 0) && (bVar2 = _internal_b9(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x200) != 0) && (bVar2 = _internal_b10(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x400) != 0) && (bVar2 = _internal_b11(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x800) != 0) && (bVar2 = _internal_b12(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x1000) != 0) && (bVar2 = _internal_b13(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x2000) != 0) && (bVar2 = _internal_b14(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x4000) != 0) && (bVar2 = _internal_b15(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x8000) != 0) && (bVar2 = _internal_b16(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if (((uVar1 & 0x10000) != 0) && (bVar2 = _internal_b17(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x20000) != 0) && (bVar2 = _internal_b18(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x40000) != 0) && (bVar2 = _internal_b19(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x80000) != 0) && (bVar2 = _internal_b20(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x100000) != 0) && (bVar2 = _internal_b21(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x200000) != 0) && (bVar2 = _internal_b22(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x400000) != 0) && (bVar2 = _internal_b23(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x800000) != 0) && (bVar2 = _internal_b24(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  if ((uVar1 & 0xff000000) != 0) {
    if (((uVar1 & 0x1000000) != 0) && (bVar2 = _internal_b25(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x2000000) != 0) && (bVar2 = _internal_b26(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x4000000) != 0) && (bVar2 = _internal_b27(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x8000000) != 0) && (bVar2 = _internal_b28(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x10000000) != 0) && (bVar2 = _internal_b29(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x20000000) != 0) && (bVar2 = _internal_b30(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x40000000) != 0) && (bVar2 = _internal_b31(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if ((uVar1 & 0x80000000) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::MessageSize<proto3_unittest::TestAllTypes>
                        ((this->field_0)._impl_.child_);
      sStack_58 = sVar4 + 2 + sStack_58;
    }
  }
  puVar3 = google::protobuf::internal::HasBits<3>::operator[](&(this->field_0)._impl_._has_bits_,1);
  uVar1 = *puVar3;
  if ((uVar1 & 0xff) != 0) {
    if (((uVar1 & 1) != 0) && (bVar2 = _internal_b32(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 2) != 0) && (bVar2 = _internal_b33(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 4) != 0) && (bVar2 = _internal_b34(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 8) != 0) && (bVar2 = _internal_b35(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x10) != 0) && (bVar2 = _internal_b36(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x20) != 0) && (bVar2 = _internal_b37(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x40) != 0) && (bVar2 = _internal_b38(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x80) != 0) && (bVar2 = _internal_b39(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if (((uVar1 & 0x100) != 0) && (bVar2 = _internal_b40(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x200) != 0) && (bVar2 = _internal_b41(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x400) != 0) && (bVar2 = _internal_b42(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x800) != 0) && (bVar2 = _internal_b43(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x1000) != 0) && (bVar2 = _internal_b44(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x2000) != 0) && (bVar2 = _internal_b45(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x4000) != 0) && (bVar2 = _internal_b46(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x8000) != 0) && (bVar2 = _internal_b47(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if (((uVar1 & 0x10000) != 0) && (bVar2 = _internal_b48(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x20000) != 0) && (bVar2 = _internal_b49(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x40000) != 0) && (bVar2 = _internal_b50(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x80000) != 0) && (bVar2 = _internal_b51(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x100000) != 0) && (bVar2 = _internal_b52(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x200000) != 0) && (bVar2 = _internal_b53(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x400000) != 0) && (bVar2 = _internal_b54(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x800000) != 0) && (bVar2 = _internal_b55(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  if ((uVar1 & 0xff000000) != 0) {
    if (((uVar1 & 0x1000000) != 0) && (bVar2 = _internal_b56(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x2000000) != 0) && (bVar2 = _internal_b57(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x4000000) != 0) && (bVar2 = _internal_b58(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x8000000) != 0) && (bVar2 = _internal_b59(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x10000000) != 0) && (bVar2 = _internal_b60(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x20000000) != 0) && (bVar2 = _internal_b61(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x40000000) != 0) && (bVar2 = _internal_b62(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x80000000) != 0) && (bVar2 = _internal_b63(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  puVar3 = google::protobuf::internal::HasBits<3>::operator[](&(this->field_0)._impl_._has_bits_,2);
  uVar1 = *puVar3;
  if ((uVar1 & 0x3f) != 0) {
    if (((uVar1 & 1) != 0) && (bVar2 = _internal_b64(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 2) != 0) && (bVar2 = _internal_b65(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 4) != 0) && (bVar2 = _internal_b66(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 8) != 0) && (bVar2 = _internal_b67(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x10) != 0) && (bVar2 = _internal_b68(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
    if (((uVar1 & 0x20) != 0) && (bVar2 = _internal_b69(this), bVar2)) {
      sStack_58 = sStack_58 + 3;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t TestHasbits::ByteSizeLong() const {
  const TestHasbits& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.TestHasbits)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // bool b1 = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_b1() != 0) {
        total_size += 2;
      }
    }
    // bool b2 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (this_._internal_b2() != 0) {
        total_size += 2;
      }
    }
    // bool b3 = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_b3() != 0) {
        total_size += 2;
      }
    }
    // bool b4 = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (this_._internal_b4() != 0) {
        total_size += 2;
      }
    }
    // bool b5 = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (this_._internal_b5() != 0) {
        total_size += 2;
      }
    }
    // bool b6 = 6;
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (this_._internal_b6() != 0) {
        total_size += 2;
      }
    }
    // bool b7 = 7;
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (this_._internal_b7() != 0) {
        total_size += 2;
      }
    }
    // bool b8 = 8;
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (this_._internal_b8() != 0) {
        total_size += 2;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // bool b9 = 9;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_b9() != 0) {
        total_size += 2;
      }
    }
    // bool b10 = 10;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_b10() != 0) {
        total_size += 2;
      }
    }
    // bool b11 = 11;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_b11() != 0) {
        total_size += 2;
      }
    }
    // bool b12 = 12;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (this_._internal_b12() != 0) {
        total_size += 2;
      }
    }
    // bool b13 = 13;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (this_._internal_b13() != 0) {
        total_size += 2;
      }
    }
    // bool b14 = 14;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_b14() != 0) {
        total_size += 2;
      }
    }
    // bool b15 = 15;
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (this_._internal_b15() != 0) {
        total_size += 2;
      }
    }
    // bool b16 = 16;
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (this_._internal_b16() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    // bool b17 = 17;
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (this_._internal_b17() != 0) {
        total_size += 3;
      }
    }
    // bool b18 = 18;
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (this_._internal_b18() != 0) {
        total_size += 3;
      }
    }
    // bool b19 = 19;
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (this_._internal_b19() != 0) {
        total_size += 3;
      }
    }
    // bool b20 = 20;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (this_._internal_b20() != 0) {
        total_size += 3;
      }
    }
    // bool b21 = 21;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_b21() != 0) {
        total_size += 3;
      }
    }
    // bool b22 = 22;
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (this_._internal_b22() != 0) {
        total_size += 3;
      }
    }
    // bool b23 = 23;
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (this_._internal_b23() != 0) {
        total_size += 3;
      }
    }
    // bool b24 = 24;
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (this_._internal_b24() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // bool b25 = 25;
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (this_._internal_b25() != 0) {
        total_size += 3;
      }
    }
    // bool b26 = 26;
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (this_._internal_b26() != 0) {
        total_size += 3;
      }
    }
    // bool b27 = 27;
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (this_._internal_b27() != 0) {
        total_size += 3;
      }
    }
    // bool b28 = 28;
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (this_._internal_b28() != 0) {
        total_size += 3;
      }
    }
    // bool b29 = 29;
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (this_._internal_b29() != 0) {
        total_size += 3;
      }
    }
    // bool b30 = 30;
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (this_._internal_b30() != 0) {
        total_size += 3;
      }
    }
    // bool b31 = 31;
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (this_._internal_b31() != 0) {
        total_size += 3;
      }
    }
    // .proto3_unittest.TestAllTypes child = 100;
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // bool b32 = 32;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_b32() != 0) {
        total_size += 3;
      }
    }
    // bool b33 = 33;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (this_._internal_b33() != 0) {
        total_size += 3;
      }
    }
    // bool b34 = 34;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_b34() != 0) {
        total_size += 3;
      }
    }
    // bool b35 = 35;
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (this_._internal_b35() != 0) {
        total_size += 3;
      }
    }
    // bool b36 = 36;
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (this_._internal_b36() != 0) {
        total_size += 3;
      }
    }
    // bool b37 = 37;
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (this_._internal_b37() != 0) {
        total_size += 3;
      }
    }
    // bool b38 = 38;
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (this_._internal_b38() != 0) {
        total_size += 3;
      }
    }
    // bool b39 = 39;
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (this_._internal_b39() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // bool b40 = 40;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_b40() != 0) {
        total_size += 3;
      }
    }
    // bool b41 = 41;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_b41() != 0) {
        total_size += 3;
      }
    }
    // bool b42 = 42;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_b42() != 0) {
        total_size += 3;
      }
    }
    // bool b43 = 43;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (this_._internal_b43() != 0) {
        total_size += 3;
      }
    }
    // bool b44 = 44;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (this_._internal_b44() != 0) {
        total_size += 3;
      }
    }
    // bool b45 = 45;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_b45() != 0) {
        total_size += 3;
      }
    }
    // bool b46 = 46;
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (this_._internal_b46() != 0) {
        total_size += 3;
      }
    }
    // bool b47 = 47;
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (this_._internal_b47() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    // bool b48 = 48;
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (this_._internal_b48() != 0) {
        total_size += 3;
      }
    }
    // bool b49 = 49;
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (this_._internal_b49() != 0) {
        total_size += 3;
      }
    }
    // bool b50 = 50;
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (this_._internal_b50() != 0) {
        total_size += 3;
      }
    }
    // bool b51 = 51;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (this_._internal_b51() != 0) {
        total_size += 3;
      }
    }
    // bool b52 = 52;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_b52() != 0) {
        total_size += 3;
      }
    }
    // bool b53 = 53;
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (this_._internal_b53() != 0) {
        total_size += 3;
      }
    }
    // bool b54 = 54;
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (this_._internal_b54() != 0) {
        total_size += 3;
      }
    }
    // bool b55 = 55;
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (this_._internal_b55() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // bool b56 = 56;
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (this_._internal_b56() != 0) {
        total_size += 3;
      }
    }
    // bool b57 = 57;
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (this_._internal_b57() != 0) {
        total_size += 3;
      }
    }
    // bool b58 = 58;
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (this_._internal_b58() != 0) {
        total_size += 3;
      }
    }
    // bool b59 = 59;
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (this_._internal_b59() != 0) {
        total_size += 3;
      }
    }
    // bool b60 = 60;
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (this_._internal_b60() != 0) {
        total_size += 3;
      }
    }
    // bool b61 = 61;
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (this_._internal_b61() != 0) {
        total_size += 3;
      }
    }
    // bool b62 = 62;
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (this_._internal_b62() != 0) {
        total_size += 3;
      }
    }
    // bool b63 = 63;
    if ((cached_has_bits & 0x80000000u) != 0) {
      if (this_._internal_b63() != 0) {
        total_size += 3;
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // bool b64 = 64;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_b64() != 0) {
        total_size += 3;
      }
    }
    // bool b65 = 65;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (this_._internal_b65() != 0) {
        total_size += 3;
      }
    }
    // bool b66 = 66;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_b66() != 0) {
        total_size += 3;
      }
    }
    // bool b67 = 67;
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (this_._internal_b67() != 0) {
        total_size += 3;
      }
    }
    // bool b68 = 68;
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (this_._internal_b68() != 0) {
        total_size += 3;
      }
    }
    // bool b69 = 69;
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (this_._internal_b69() != 0) {
        total_size += 3;
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}